

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

String * __thiscall
glcts::ShaderStorageBufferLayoutBindingCase::buildBlockName
          (String *__return_storage_ptr__,ShaderStorageBufferLayoutBindingCase *this,String *name)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  return __return_storage_ptr__;
}

Assistant:

String buildBlockName(const String& name)
	{
		return name;
	}